

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

uint32_t find_rec(char *name)

{
  int iVar1;
  size_t sVar2;
  char *in_RDI;
  uint32_t n;
  char *p;
  uint32_t local_1c;
  uint8_t *local_18;
  
  local_1c = 2;
  for (local_18 = obuf; *local_18 != '\0'; local_18 = local_18 + sVar2 + 1) {
    iVar1 = strcmp((char *)local_18,in_RDI);
    if (iVar1 == 0) {
      return local_1c;
    }
    sVar2 = strlen((char *)local_18);
    local_1c = local_1c + 1;
  }
  sVar2 = strlen(in_RDI);
  if (local_18 + sVar2 + 1 <= obuf + 0x1fff) {
    strcpy((char *)local_18,in_RDI);
    return local_1c;
  }
  fprintf(_stderr,"Error: output buffer overflow\n");
  exit(1);
}

Assistant:

static uint32_t find_rec(char *name)
{
  char *p = (char *)obuf;
  uint32_t n;
  for (n = 2; *p; n++) {
    if (strcmp(p, name) == 0)
      return n;
    p += strlen(p)+1;
  }
  if (p+strlen(name)+1 >= (char *)obuf+sizeof(obuf)) {
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  strcpy(p, name);
  return n;
}